

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_CreateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_CreateSessionRequest *request,
               UA_CreateSessionResponse *response)

{
  UA_Byte **sm;
  size_t sVar1;
  undefined2 uVar2;
  UA_NodeIdType UVar3;
  UA_Session *pUVar4;
  UA_CreateSessionRequest *pUVar5;
  UA_StatusCode UVar6;
  UA_SecureChannel *channel_00;
  long lVar7;
  ulong uVar8;
  UA_Session *local_50;
  UA_Session *newSession;
  UA_SecureChannel *local_40;
  UA_CreateSessionRequest *local_38;
  
  if ((channel->securityToken).channelId == 0) {
    (response->responseHeader).serviceResult = 0x80220000;
  }
  else {
    channel_00 = (UA_SecureChannel *)server->endpointDescriptionsSize;
    UVar6 = UA_Array_copy(server->endpointDescriptions,(size_t)channel_00,&response->serverEndpoints
                          ,UA_TYPES + 0x9b);
    (response->responseHeader).serviceResult = UVar6;
    if (UVar6 == 0) {
      sVar1 = server->endpointDescriptionsSize;
      response->serverEndpointsSize = sVar1;
      newSession = (UA_Session *)server;
      local_40 = channel;
      local_38 = request;
      if (sVar1 != 0) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          channel_00 = (UA_SecureChannel *)
                       ((long)&(response->serverEndpoints->endpointUrl).length + lVar7);
          UA_copy(&request->endpointUrl,channel_00,UA_TYPES + 0xb);
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0xd8;
        } while (uVar8 < response->serverEndpointsSize);
      }
      pUVar5 = local_38;
      pUVar4 = newSession;
      sm = &(newSession->clientDescription).applicationName.text.data;
      UVar6 = UA_SessionManager_createSession((UA_SessionManager *)sm,channel_00,local_38,&local_50)
      ;
      (response->responseHeader).serviceResult = UVar6;
      if (UVar6 == 0) {
        local_50->maxResponseMessageSize = pUVar5->maxResponseMessageSize;
        local_50->maxRequestMessageSize = (local_40->connection->localConf).maxMessageSize;
        (response->sessionId).identifier.string.data = (local_50->sessionId).identifier.string.data;
        uVar2 = *(undefined2 *)&(local_50->sessionId).field_0x2;
        UVar3 = (local_50->sessionId).identifierType;
        sVar1 = (local_50->sessionId).identifier.string.length;
        (response->sessionId).namespaceIndex = (local_50->sessionId).namespaceIndex;
        *(undefined2 *)&(response->sessionId).field_0x2 = uVar2;
        (response->sessionId).identifierType = UVar3;
        (response->sessionId).identifier.string.length = sVar1;
        response->revisedSessionTimeout = local_50->timeout;
        uVar2 = *(undefined2 *)&(local_50->authenticationToken).field_0x2;
        UVar3 = (local_50->authenticationToken).identifierType;
        sVar1 = (local_50->authenticationToken).identifier.string.length;
        (response->authenticationToken).namespaceIndex =
             (local_50->authenticationToken).namespaceIndex;
        *(undefined2 *)&(response->authenticationToken).field_0x2 = uVar2;
        (response->authenticationToken).identifierType = UVar3;
        (response->authenticationToken).identifier.string.length = sVar1;
        (response->authenticationToken).identifier.string.data =
             (local_50->authenticationToken).identifier.string.data;
        UVar6 = UA_copy(&pUVar5->sessionName,&local_50->sessionName,UA_TYPES + 0xb);
        (response->responseHeader).serviceResult = UVar6;
        if ((pUVar4->clientDescription).applicationUri.data != (UA_Byte *)0x0) {
          UVar6 = UA_copy((void *)((pUVar4->clientDescription).productUri.length + 0x88),
                          &response->serverCertificate,UA_TYPES + 0xe);
          UVar6 = UVar6 | (response->responseHeader).serviceResult;
          (response->responseHeader).serviceResult = UVar6;
        }
        if (UVar6 != 0) {
          UA_SessionManager_removeSession((UA_SessionManager *)sm,&local_50->authenticationToken);
        }
      }
    }
  }
  return;
}

Assistant:

void Service_CreateSession(UA_Server *server, UA_SecureChannel *channel,
                           const UA_CreateSessionRequest *request,
                           UA_CreateSessionResponse *response) {
    if(channel->securityToken.channelId == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSECURECHANNELIDINVALID;
        return;
    }

    /* Copy the server's endpoint into the response */
    response->responseHeader.serviceResult =
        UA_Array_copy(server->endpointDescriptions, server->endpointDescriptionsSize,
                      (void**)&response->serverEndpoints, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        return;
    response->serverEndpointsSize = server->endpointDescriptionsSize;

    /* Mirror back the endpointUrl */
    for(size_t i = 0; i < response->serverEndpointsSize; ++i)
        UA_String_copy(&request->endpointUrl, &response->serverEndpoints[i].endpointUrl);

    UA_Session *newSession;
    response->responseHeader.serviceResult =
        UA_SessionManager_createSession(&server->sessionManager, channel, request, &newSession);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Processing CreateSessionRequest failed");
        return;
    }

    newSession->maxResponseMessageSize = request->maxResponseMessageSize;
    newSession->maxRequestMessageSize = channel->connection->localConf.maxMessageSize;
    response->sessionId = newSession->sessionId;
    response->revisedSessionTimeout = (UA_Double)newSession->timeout;
    response->authenticationToken = newSession->authenticationToken;
    response->responseHeader.serviceResult = UA_String_copy(&request->sessionName, &newSession->sessionName);
    if(server->endpointDescriptionsSize > 0)
        response->responseHeader.serviceResult |=
            UA_ByteString_copy(&server->endpointDescriptions->serverCertificate,
                               &response->serverCertificate);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_SessionManager_removeSession(&server->sessionManager, &newSession->authenticationToken);
         return;
    }
    UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Session " UA_PRINTF_GUID_FORMAT " created",
                         UA_PRINTF_GUID_DATA(newSession->sessionId.identifier.guid));
}